

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O0

string * SettingToString(SettingsValue *value,string *strDefault)

{
  string *in_RDI;
  long in_FS_OFFSET;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff88;
  string *__u;
  SettingsValue *value_00;
  pointer local_8;
  
  local_8 = *(pointer *)(in_FS_OFFSET + 0x28);
  value_00 = (SettingsValue *)&stack0xffffffffffffffd0;
  __u = in_RDI;
  SettingToString_abi_cxx11_(value_00);
  std::optional<std::__cxx11::string>::value_or<std::__cxx11::string_const&>
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)value_00,__u);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(in_stack_ffffffffffffff88);
  if (*(pointer *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string SettingToString(const common::SettingsValue& value, const std::string& strDefault)
{
    return SettingToString(value).value_or(strDefault);
}